

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointLight.cpp
# Opt level: O2

double __thiscall PointLight::shadow(PointLight *this,Scene *scene,Vector *p,Vector *l)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  double t;
  SurfaceData texture;
  double local_100;
  double local_f8;
  double local_f0;
  undefined1 local_e8 [16];
  double local_d8;
  double local_d0;
  double dStack_c8;
  double local_c0;
  SurfaceData local_b0;
  
  dVar1 = (this->loc).z - p->z;
  dVar5 = (this->loc).x - p->x;
  dVar6 = (this->loc).y - p->y;
  l->x = dVar5;
  l->y = dVar6;
  l->z = dVar1;
  local_f8 = SQRT(dVar1 * dVar1 + dVar5 * dVar5 + dVar6 * dVar6);
  local_100 = this->dist_scale / local_f8;
  local_100 = local_100 * local_100;
  Vector::operator/=(l,local_f8);
  local_e8._0_8_ = p->x;
  local_e8._8_8_ = p->y;
  local_d8 = p->z;
  local_d0 = l->x;
  dStack_c8 = l->y;
  local_c0 = l->z;
  while( true ) {
    iVar2 = (*scene->_vptr_Scene[2])(scene,(Vector *)local_e8,&local_f0);
    if (((GeometricObject *)CONCAT44(extraout_var,iVar2) == (GeometricObject *)0x0) ||
       (local_f8 <= local_f0)) break;
    local_d8 = local_c0 * local_f0 + local_d8;
    dVar1 = local_f0 * dStack_c8 + (double)local_e8._8_8_;
    local_e8._8_4_ = SUB84(dVar1,0);
    local_e8._0_8_ = local_f0 * local_d0 + (double)local_e8._0_8_;
    local_e8._12_4_ = (int)((ulong)dVar1 >> 0x20);
    GeometricObject::find_texture
              ((GeometricObject *)CONCAT44(extraout_var,iVar2),(Vector *)local_e8,&local_b0);
    uVar3 = 0;
    uVar4 = 0;
    if ((local_b0.kt < threshold) || (local_100 = local_100 * local_b0.kt, local_100 < threshold))
    goto LAB_001042b0;
    local_f8 = local_f8 - local_f0;
  }
  uVar3 = SUB84(local_100,0);
  uVar4 = (undefined4)((ulong)local_100 >> 0x20);
LAB_001042b0:
  return (double)CONCAT44(uVar4,uVar3);
}

Assistant:

double PointLight::shadow(Scene* scene, Vector&  p, Vector& l)
{
   l = loc - p;

   double t;
   double dist = !l;
   double attenuation = dist_scale  / dist;
   attenuation = attenuation *   attenuation;

   l /= dist;

   Ray   r(p,l);
   SurfaceData texture;
   GeometricObject *occlude;

   while ((occlude = scene->intersect(r,t)) != 0 && dist > t)
   {
      r.org = r.point(t);

      occlude->find_texture(r.org, texture);

      if (texture.kt < threshold) return 0; // объект непрозрачен
      if ((attenuation *= texture.kt) < threshold) return 0;
      dist -= t;
   }
   return attenuation;
}